

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

bool __thiscall VWReaderHandler<true>::EndObject(VWReaderHandler<true> *this,SizeType count)

{
  int iVar1;
  undefined4 extraout_var;
  BaseState<true> *pBVar2;
  
  pBVar2 = (this->ctx).current_state;
  iVar1 = (*pBVar2->_vptr_BaseState[7])(pBVar2,this,count);
  pBVar2 = (BaseState<true> *)CONCAT44(extraout_var,iVar1);
  if (pBVar2 != (BaseState<true> *)0x0) {
    (this->ctx).previous_state = (this->ctx).current_state;
    (this->ctx).current_state = pBVar2;
  }
  return pBVar2 != (BaseState<true> *)0x0;
}

Assistant:

bool EndObject(SizeType count) { return ctx.TransitionState(ctx.current_state->EndObject(ctx, count)); }